

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* getPredefinedTransformations1L1Q1P<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,Matrix<double,_4,_1,_0,_4,_1> *P1,
            Matrix<double,_4,_1,_0,_4,_1> *P1_B,Matrix<double,_4,_1,_0,_4,_1> *Pi,
            Matrix<double,_4,_1,_0,_4,_1> *Pi_B)

{
  double dVar1;
  iterator __position;
  double dVar2;
  vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>> *this;
  PointerType ptr;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
  *eval;
  ActualDstType actualDst;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar3;
  iterator iVar4;
  SrcXprType *src;
  scalar_sum_op<double,_double> *func;
  long lVar5;
  assign_op<double,_double> *paVar6;
  byte bVar7;
  Scalar SVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  RealScalar z_1;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  RealScalar z;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  RealScalar z_2;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  type tmp;
  Matrix<double,_3,_1,_0,_3,_1> v3;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *out;
  Matrix<double,_4,_4,_0,_4,_4> transV_B;
  Matrix<double,_4,_4,_0,_4,_4> transV;
  Matrix<double,_4,_4,_0,_4,_4> TP;
  Matrix<double,_4,_4,_0,_4,_4> transU_B;
  Matrix<double,_4,_4,_0,_4,_4> TP_B;
  Matrix<double,_4,_1,_0,_4,_1> Pi_B1;
  Matrix<double,_4,_1,_0,_4,_1> Pi_1;
  Matrix<double,_4,_4,_0,_4,_4> transU;
  Matrix<double,_4,_4,_1,_4,_4> local_488;
  Matrix<double,_4,_1,_0,_4,_1> *local_408;
  Matrix<double,_4,_4,_1,_4,_4> *local_400;
  Matrix<double,_4,_1,_0,_4,_1> *local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8 [16];
  double local_3d8;
  Matrix<double,_3,_1,_0,_3,_1> local_3c8;
  vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>> *local_3b0
  ;
  Matrix<double,_4,_1,_0,_4,_1> *local_3a8;
  Matrix<double,_4,_1,_0,_4,_1> *local_3a0;
  undefined1 local_398 [16];
  Matrix<double,_4,_1,_0,_4,_1> local_388;
  double local_368;
  double dStack_360;
  double local_358;
  double dStack_350;
  double local_348;
  double dStack_340;
  double local_338;
  double dStack_330;
  double local_328;
  double dStack_320;
  undefined1 local_318 [16];
  Matrix<double,_4,_1,_0,_4,_1> local_308;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  Matrix<double,_4,_4,_0,_4,_4> local_298;
  double local_218 [12];
  undefined1 local_1b8 [16];
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  double dStack_180;
  Matrix<double,_4,_4,_0,_4,_4> local_178;
  Matrix<double,_4,_1,_0,_4,_1> local_f8;
  Matrix<double,_4,_1,_0,_4,_1> local_d8;
  undefined1 local_b8 [16];
  double local_a8;
  Matrix<double,_4,_1,_0,_4,_1> *apMStack_a0 [9];
  double local_58;
  double dStack_50;
  double local_48;
  undefined8 uStack_40;
  
  bVar7 = 0;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  lVar5 = 0;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[4] =
       0.0;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[6] =
       1.97626258336499e-323;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[8] =
       1.48219693752374e-323;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xd]
       = 1.97626258336499e-323;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0] =
       (double)P1;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3] =
       (double)P1;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[7] =
       (double)Pi;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[10]
       = (double)Pi;
  local_3b0 = (vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
               *)__return_storage_ptr__;
  local_b8._8_8_ = P1;
  apMStack_a0[0] = Pi;
  SVar8 = Eigen::internal::
          redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>const,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>const>>,3,0>
          ::
          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const>>
                    ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                      *)local_b8,(scalar_sum_op<double,_double> *)local_218,
                     (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                      *)&local_488);
  dVar9 = SVar8 + (Pi->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
                  m_data.array[3];
  local_188 = (P1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[0] -
              (Pi->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[0] * dVar9;
  dStack_180 = (P1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
               array[1] -
               (Pi->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
               array[1] * dVar9;
  local_198 = (P1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[2] -
              dVar9 * (Pi->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
                      m_data.array[2];
  uStack_190 = 0;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[4] =
       0.0;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[6] =
       1.97626258336499e-323;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[8] =
       1.48219693752374e-323;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xd]
       = 1.97626258336499e-323;
  eval = (redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
          *)local_b8;
  func = (scalar_sum_op<double,_double> *)local_218;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0] =
       (double)P1_B;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3] =
       (double)P1_B;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[7] =
       (double)Pi_B;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[10]
       = (double)Pi_B;
  local_3a0 = Pi;
  local_b8._8_8_ = P1_B;
  apMStack_a0[0] = Pi_B;
  SVar8 = Eigen::internal::
          redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>const,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>const>>,3,0>
          ::
          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const>>
                    (eval,func,
                     (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                      *)&local_488);
  dVar10 = SVar8 + (Pi_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
                   m_data.array[3];
  dVar13 = (P1_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
           array[0];
  dVar2 = (Pi_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[0];
  dVar12 = (P1_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
           array[1] -
           (Pi_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
           array[1] * dVar10;
  dVar9 = (Pi_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[2];
  dVar1 = (P1_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[2];
  local_b8._0_8_ = 0.0;
  local_b8._8_8_ = (PointerType)0x0;
  local_a8 = 0.0;
  apMStack_a0[0] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[1] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[2] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[3] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[4] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[5] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[6] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[7] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  apMStack_a0[8] = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  uStack_40 = 0;
  do {
    *(undefined8 *)
     &(eval->
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
      ).
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d = 0x3ff0000000000000;
    lVar5 = lVar5 + 0x20;
    eval = eval + 1;
  } while (lVar5 != 0x80);
  local_58 = -local_188;
  dStack_50 = -dStack_180;
  local_48 = -local_198;
  local_218[0] = 0.0;
  local_218[1] = 0.0;
  local_218[2] = 0.0;
  local_218[3] = 0.0;
  local_218[4] = 0.0;
  local_218[5] = 0.0;
  local_218[6] = 0.0;
  local_218[7] = 0.0;
  local_218[8] = 0.0;
  local_218[9] = 0.0;
  local_218[10] = 0.0;
  local_218[0xb] = 0.0;
  uStack_1a0 = 0;
  lVar5 = 0;
  do {
    *(undefined8 *)func = 0x3ff0000000000000;
    lVar5 = lVar5 + 0x20;
    func = func + 0x28;
  } while (lVar5 != 0x80);
  local_1b8._8_4_ = SUB84(dVar12,0);
  local_1b8._0_8_ = -(dVar13 - dVar2 * dVar10);
  local_1b8._12_4_ = (uint)((ulong)dVar12 >> 0x20) ^ 0x80000000;
  local_1a8 = -(dVar1 - dVar10 * dVar9);
  local_318._0_8_ = local_b8;
  local_318._8_8_ = local_3a0;
  local_3a8 = Pi_B;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&local_488,(SrcXprType *)local_318,(assign_op<double,_double> *)local_398);
  local_408 = (Matrix<double,_4,_1,_0,_4,_1> *)local_318._8_8_;
  local_3f8 = (Matrix<double,_4,_1,_0,_4,_1> *)local_318._8_8_;
  local_3f0 = 4;
  if ((local_318._8_8_ & 0xf) == 0) {
    dVar9 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_318._8_8_)->m_storage)
            .m_data.array[0];
    dVar1 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_318._8_8_)->m_storage)
            .m_data.array[1];
    dVar12 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_318._8_8_)->m_storage
             ).m_data.array[2];
    dVar13 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_318._8_8_)->m_storage
             ).m_data.array[3];
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[3] * dVar13 +
           local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[1] * dVar1 +
           local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[2] * dVar12 +
           local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[0] * dVar9;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[7] * dVar13 +
           local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[5] * dVar1 +
           local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[6] * dVar12 +
           local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[4] * dVar9;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[0xb] * dVar13 +
           local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[9] * dVar1 +
           local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[10] * dVar12 +
           local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[8] * dVar9;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = dVar13 * local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[0xf] +
           dVar1 * local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[0xd] +
           dVar12 * local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[0xe] +
           dVar9 * local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[0xc];
    local_318._0_8_ = local_218;
    src = (SrcXprType *)local_318;
    local_318._8_8_ = local_3a8;
    paVar6 = (assign_op<double,_double> *)local_398;
    local_400 = &local_488;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_488,src,paVar6);
    local_408 = (Matrix<double,_4,_1,_0,_4,_1> *)local_318._8_8_;
    local_3f8 = (Matrix<double,_4,_1,_0,_4,_1> *)local_318._8_8_;
    local_3f0 = 4;
    if ((local_318._8_8_ & 0xf) == 0) {
      dVar9 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_318._8_8_)->
              m_storage).m_data.array[0];
      dVar1 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_318._8_8_)->
              m_storage).m_data.array[1];
      dVar12 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_318._8_8_)->
               m_storage).m_data.array[2];
      dVar13 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_318._8_8_)->
               m_storage).m_data.array[3];
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [0] = local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[3] * dVar13 +
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[1] * dVar1 +
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[2] * dVar12 +
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0] * dVar9;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [1] = local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[7] * dVar13 +
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[5] * dVar1 +
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[6] * dVar12 +
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[4] * dVar9;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [2] = local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0xb] * dVar13 +
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[9] * dVar1 +
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[10] * dVar12 +
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[8] * dVar9;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [3] = dVar13 * local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0xf] +
            dVar1 * local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[0xd] +
            dVar12 * local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0xe] +
            dVar9 * local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[0xc];
      local_318._0_8_ = (non_const_type)0x0;
      local_318._8_8_ = 0.0;
      local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [0] = 0.0;
      local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [1] = 0.0;
      local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [2] = 0.0;
      local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [3] = 0.0;
      local_2e8 = 0.0;
      dStack_2e0 = 0.0;
      local_2d8 = 0.0;
      dStack_2d0 = 0.0;
      local_2c8 = 0.0;
      dStack_2c0 = 0.0;
      local_2b8 = 0.0;
      dStack_2b0 = 0.0;
      local_2a8 = 0.0;
      dStack_2a0 = 0.0;
      lVar5 = 0;
      do {
        (src->m_xpr).m_matrix = (non_const_type)0x3ff0000000000000;
        lVar5 = lVar5 + 0x20;
        src = src + 5;
      } while (lVar5 != 0x80);
      local_328 = 0.0;
      dStack_320 = 0.0;
      local_338 = 0.0;
      dStack_330 = 0.0;
      local_348 = 0.0;
      dStack_340 = 0.0;
      local_358 = 0.0;
      dStack_350 = 0.0;
      local_368 = 0.0;
      dStack_360 = 0.0;
      local_388.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [2] = 0.0;
      local_388.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [3] = 0.0;
      local_388.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [0] = 0.0;
      local_388.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [1] = 0.0;
      local_398._0_8_ = 0.0;
      local_398._8_8_ = 0.0;
      lVar5 = 0;
      do {
        *(undefined8 *)paVar6 = 0x3ff0000000000000;
        lVar5 = lVar5 + 0x20;
        paVar6 = paVar6 + 0x28;
      } while (lVar5 != 0x80);
      local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [0] = (double)(&local_f8 + 1);
      local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [1] = 1.48219693752374e-323;
      local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [4] = 0.0;
      local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [6] = 1.97626258336499e-323;
      local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [3] = local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0];
      local_400 = &local_488;
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::
      normalized((PlainObject *)&local_298,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                 &local_488);
      if (local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[4] != 1.48219693752374e-323) {
LAB_0015004a:
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 1>]"
                     );
      }
      local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0];
      local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[1];
      local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[2];
      auVar22._0_8_ =
           -local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[2];
      auVar22._8_8_ = 0x8000000000000000;
      dVar9 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[1] * 0.0 -
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0];
      dVar1 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[1] -
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0] * 0.0;
      auVar15._0_8_ =
           local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[2] +
           local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[1] * -0.0;
      local_3e8._0_8_ =
           local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[2] * 0.0 +
           local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[1] * -0.0;
      local_3e8._8_8_ =
           local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0] * 0.0 + auVar22._0_8_;
      dVar12 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[2] * -0.0 +
               local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0] * 0.0;
      auVar15._8_8_ = dVar12;
      dVar13 = dVar1 * dVar1 +
               (double)local_3e8._8_8_ * (double)local_3e8._8_8_ +
               (double)local_3e8._0_8_ * (double)local_3e8._0_8_;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar13;
      auVar17 = sqrtpd(auVar22,auVar17);
      dVar12 = dVar9 * dVar9 + dVar12 * dVar12 + auVar15._0_8_ * auVar15._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar12;
      auVar22 = sqrtpd(auVar21,auVar21);
      auVar18._0_8_ = auVar17._0_8_;
      auVar23._0_8_ = auVar22._0_8_;
      if (auVar23._0_8_ <= auVar18._0_8_) {
        if (0.0 < dVar13) {
          auVar18._8_8_ = auVar18._0_8_;
          local_3e8 = divpd(local_3e8,auVar18);
        }
        local_3d8 = (double)(~-(ulong)(0.0 < dVar13) & (ulong)dVar1 |
                            (ulong)(dVar1 / auVar18._0_8_) & -(ulong)(0.0 < dVar13));
      }
      else {
        local_3e8 = auVar15;
        if (0.0 < dVar12) {
          auVar23._8_8_ = auVar23._0_8_;
          local_3e8 = divpd(auVar15,auVar23);
        }
        local_3d8 = (double)(~-(ulong)(0.0 < dVar12) & (ulong)dVar9 |
                            (ulong)(dVar9 / auVar23._0_8_) & -(ulong)(0.0 < dVar12));
      }
      local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [1] = 4.94065645841247e-324;
      local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [2] = 1.48219693752374e-323;
      local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [4] = 0.0;
      local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [5] = 0.0;
      local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [6] = 1.97626258336499e-323;
      local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [0] = (double)local_318;
      local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [3] = (double)local_318;
      local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)local_3e8;
      Eigen::internal::
      check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&local_488,
                 (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_298);
      if ((local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[1] == 4.94065645841247e-324) &&
         (local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[2] == 1.48219693752374e-323)) {
        lVar5 = 0;
        do {
          *(undefined8 *)
           ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                   local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[0])->m_storage).m_data.array + lVar5 * 4) =
               *(undefined8 *)
                ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0])->m_storage).m_data.array + lVar5);
          lVar5 = lVar5 + 8;
        } while (lVar5 != 0x18);
        local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = local_3d8 *
                   local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1] -
                   local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] * (double)local_3e8._8_8_;
        local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = (double)local_3e8._0_8_ *
                   local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] -
                   local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0] * local_3d8;
        local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[2] = local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0] * (double)local_3e8._8_8_ -
                   (double)local_3e8._0_8_ *
                   local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1];
        local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[0] = (double)(local_318 + 8);
        local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[1] = 4.94065645841247e-324;
        local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[2] = 1.48219693752374e-323;
        local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[4] = 4.94065645841247e-324;
        local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[5] = 0.0;
        local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[6] = 1.97626258336499e-323;
        local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[3] = (double)local_318;
        local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = (double)&local_298;
        Eigen::internal::
        check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                  ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&local_488,
                   (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_178);
        if ((local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[1] == 4.94065645841247e-324) &&
           (local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[2] == 1.48219693752374e-323)) {
          lVar5 = 0;
          do {
            *(undefined8 *)
             ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                     local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0])->m_storage).m_data.array + lVar5 * 4) =
                 *(undefined8 *)
                  ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                          local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0])->m_storage).m_data.array + lVar5);
            lVar5 = lVar5 + 8;
          } while (lVar5 != 0x18);
          local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0] = (double)&local_308;
          local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[1] = 4.94065645841247e-324;
          local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[2] = 1.48219693752374e-323;
          local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[4] = 9.88131291682493e-324;
          local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[5] = 0.0;
          local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[6] = 1.97626258336499e-323;
          local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[3] = (double)local_318;
          local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0] = (double)&local_3c8;
          Eigen::internal::
          check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                    ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&local_488,
                     (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_298);
          if ((local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
               m_data.array[1] == 4.94065645841247e-324) &&
             (local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[2] == 1.48219693752374e-323)) {
            lVar5 = 0;
            do {
              *(undefined8 *)
               ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[0])->m_storage).m_data.array + lVar5 * 4) =
                   *(undefined8 *)
                    ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array[0])->m_storage).m_data.array + lVar5);
              lVar5 = lVar5 + 8;
            } while (lVar5 != 0x18);
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0] = (double)&local_f8;
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[1] = 1.48219693752374e-323;
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[4] = 0.0;
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[6] = 1.97626258336499e-323;
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[3] = local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[0];
            Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::
            normalized((PlainObject *)&local_298,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                        *)&local_488);
            if (local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[4] != 1.48219693752374e-323) goto LAB_0015004a;
            local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0];
            local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[1];
            local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[2];
            dVar9 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[1] * 0.0 -
                    local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0];
            dVar1 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[1] -
                    local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array[0] * 0.0;
            local_3e8._0_8_ =
                 local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[2] +
                 local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[1] * -0.0;
            auVar11._0_8_ =
                 local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[2] * 0.0 +
                 local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[1] * -0.0;
            auVar11._8_8_ =
                 local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0] * 0.0 +
                 -local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[2];
            dVar12 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[2] * -0.0 +
                     local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[0] * 0.0;
            local_3e8._8_8_ = dVar12;
            dVar13 = dVar1 * dVar1 + auVar11._8_8_ * auVar11._8_8_ + auVar11._0_8_ * auVar11._0_8_;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = dVar13;
            auVar15 = sqrtpd(auVar14,auVar14);
            dVar12 = dVar9 * dVar9 +
                     dVar12 * dVar12 + (double)local_3e8._0_8_ * (double)local_3e8._0_8_;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = dVar12;
            auVar17 = sqrtpd(auVar19,auVar19);
            auVar16._0_8_ = auVar15._0_8_;
            auVar20._0_8_ = auVar17._0_8_;
            if (auVar20._0_8_ <= auVar16._0_8_) {
              local_3d8 = (double)(~-(ulong)(0.0 < dVar13) & (ulong)dVar1 |
                                  (ulong)(dVar1 / auVar16._0_8_) & -(ulong)(0.0 < dVar13));
              local_3e8 = auVar11;
              if (0.0 < dVar13) {
                auVar16._8_8_ = auVar16._0_8_;
                local_3e8 = divpd(auVar11,auVar16);
              }
            }
            else {
              local_3d8 = (double)(~-(ulong)(0.0 < dVar12) & (ulong)dVar9 |
                                  (ulong)(dVar9 / auVar20._0_8_) & -(ulong)(0.0 < dVar12));
              if (0.0 < dVar12) {
                auVar20._8_8_ = auVar20._0_8_;
                local_3e8 = divpd(local_3e8,auVar20);
              }
            }
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[1] = 4.94065645841247e-324;
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[2] = 1.48219693752374e-323;
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[4] = 0.0;
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[5] = 0.0;
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[6] = 1.97626258336499e-323;
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0] = (double)local_398;
            local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[3] = (double)local_398;
            local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0] = (double)local_3e8;
            Eigen::internal::
            check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                      ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&local_488,
                       (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_298);
            if ((local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[1] == 4.94065645841247e-324) &&
               (local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[2] == 1.48219693752374e-323)) {
              lVar5 = 0;
              do {
                *(undefined8 *)
                 ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                         local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[0])->m_storage).m_data.array + lVar5 * 4) =
                     *(undefined8 *)
                      ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                              local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                              .m_storage.m_data.array[0])->m_storage).m_data.array + lVar5);
                lVar5 = lVar5 + 8;
              } while (lVar5 != 0x18);
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0] =
                   local_3d8 *
                   local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1] -
                   local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] * (double)local_3e8._8_8_;
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[1] =
                   (double)local_3e8._0_8_ *
                   local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] -
                   local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0] * local_3d8;
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[2] =
                   local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0] * (double)local_3e8._8_8_ -
                   (double)local_3e8._0_8_ *
                   local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1];
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[0] = (double)(local_398 + 8);
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[1] = 4.94065645841247e-324;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[2] = 1.48219693752374e-323;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[4] = 4.94065645841247e-324;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[5] = 0.0;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[6] = 1.97626258336499e-323;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[3] = (double)local_398;
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0] = (double)&local_298;
              Eigen::internal::
              check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                        ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&local_488,
                         (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_178);
              if ((local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[1] == 4.94065645841247e-324) &&
                 (local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[2] == 1.48219693752374e-323)) {
                lVar5 = 0;
                do {
                  *(undefined8 *)
                   ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                           local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array[0])->m_storage).m_data.array + lVar5 * 4) =
                       *(undefined8 *)
                        ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                                local_178.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0])->m_storage).m_data.array + lVar5);
                  lVar5 = lVar5 + 8;
                } while (lVar5 != 0x18);
                local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[0] = (double)(local_398 + 0x10);
                local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[1] = 4.94065645841247e-324;
                local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[2] = 1.48219693752374e-323;
                local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[4] = 9.88131291682493e-324;
                local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[5] = 0.0;
                local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[6] = 1.97626258336499e-323;
                local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[3] = (double)local_398;
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0] = (double)&local_3c8;
                Eigen::internal::
                check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                          ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&local_488,
                           (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_298);
                this = local_3b0;
                if ((local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[1] == 4.94065645841247e-324) &&
                   (local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[2] == 1.48219693752374e-323)) {
                  lVar5 = 0;
                  do {
                    *(undefined8 *)
                     ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                             local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                             m_storage.m_data.array[0])->m_storage).m_data.array + lVar5 * 4) =
                         *(undefined8 *)
                          ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                  local_298.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0])->m_storage).m_data.array + lVar5);
                    lVar5 = lVar5 + 8;
                  } while (lVar5 != 0x18);
                  *(undefined8 *)local_3b0 = 0;
                  *(undefined8 *)(local_3b0 + 8) = 0;
                  *(undefined8 *)(local_3b0 + 0x10) = 0;
                  lVar5 = 0;
                  do {
                    dVar9 = *(double *)(local_b8 + lVar5);
                    dVar1 = *(double *)(local_b8 + lVar5 + 8);
                    dVar12 = *(double *)((long)apMStack_a0 + lVar5 + -8);
                    dVar13 = *(double *)((long)apMStack_a0 + lVar5);
                    *(double *)
                     ((long)local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array + lVar5) =
                         local_2b8 * dVar13 +
                         local_2d8 * dVar12 +
                         local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[2] * dVar1 + (double)local_318._0_8_ * dVar9;
                    *(double *)
                     ((long)local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array + lVar5 + 8) =
                         dStack_2b0 * dVar13 +
                         dStack_2d0 * dVar12 +
                         local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[3] * dVar1 + (double)local_318._8_8_ * dVar9;
                    *(double *)
                     ((long)local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array + lVar5 + 0x10) =
                         dVar13 * local_2a8 +
                         dVar12 * local_2c8 +
                         dVar1 * local_2e8 +
                         dVar9 * local_308.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[0];
                    *(double *)
                     ((long)local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array + lVar5 + 0x18) =
                         dVar13 * dStack_2a0 +
                         dVar12 * dStack_2c0 +
                         dVar1 * dStack_2e0 +
                         dVar9 * local_308.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[1];
                    lVar5 = lVar5 + 0x20;
                  } while (lVar5 != 0x80);
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[0];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[1] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[1];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[2] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[2];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[3] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[3];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[4] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[4];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[5] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[5];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[6] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[6];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[7] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[7];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[8] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[8];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[9] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[9];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[10] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[10];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xb] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[0xb];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xc] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[0xc];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[0xd];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xe] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[0xe];
                  local_298.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xf] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[0xf];
                  std::
                  vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                  ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                            (local_3b0,(iterator)0x0,&local_298);
                  lVar5 = 0;
                  do {
                    dVar9 = *(double *)((long)local_218 + lVar5);
                    dVar1 = *(double *)((long)local_218 + lVar5 + 8);
                    dVar12 = *(double *)((long)local_218 + lVar5 + 0x10);
                    dVar13 = *(double *)((long)local_218 + lVar5 + 0x18);
                    *(double *)
                     ((long)local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array + lVar5) =
                         local_338 * dVar13 +
                         local_358 * dVar12 +
                         local_388.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[2] * dVar1 + (double)local_398._0_8_ * dVar9;
                    *(double *)
                     ((long)local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array + lVar5 + 8) =
                         dStack_330 * dVar13 +
                         dStack_350 * dVar12 +
                         local_388.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[3] * dVar1 + (double)local_398._8_8_ * dVar9;
                    *(double *)
                     ((long)local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array + lVar5 + 0x10) =
                         dVar13 * local_328 +
                         dVar12 * local_348 +
                         dVar1 * local_368 +
                         dVar9 * local_388.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[0];
                    *(double *)
                     ((long)local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array + lVar5 + 0x18) =
                         dVar13 * dStack_320 +
                         dVar12 * dStack_340 +
                         dVar1 * dStack_360 +
                         dVar9 * local_388.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[1];
                    lVar5 = lVar5 + 0x20;
                  } while (lVar5 != 0x80);
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[0];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[1] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[1];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[2] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[2];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[3] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[3];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[4] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[4];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[5] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[5];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[6] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[6];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[7] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[7];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[8] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[8];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[9] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[9];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[10] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[10];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xb] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[0xb];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xc] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[0xc];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[0xd];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xe] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[0xe];
                  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xf] =
                       local_488.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                       m_storage.m_data.array[0xf];
                  __position._M_current = *(Matrix<double,_4,_4,_0,_4,_4> **)(this + 8);
                  if (__position._M_current == *(Matrix<double,_4,_4,_0,_4,_4> **)(this + 0x10)) {
                    std::
                    vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                    ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                              (this,__position,&local_178);
                  }
                  else {
                    pMVar3 = &local_178;
                    iVar4._M_current = __position._M_current;
                    for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
                      ((iVar4._M_current)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array[0] = (pMVar3->
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                                  m_storage.m_data.array[0];
                      pMVar3 = (Matrix<double,_4,_4,_0,_4,_4> *)
                               ((long)pMVar3 + ((ulong)bVar7 * -2 + 1) * 8);
                      iVar4._M_current =
                           (Matrix<double,_4,_4,_0,_4,_4> *)
                           ((long)iVar4._M_current + ((ulong)bVar7 * -2 + 1) * 8);
                    }
                    *(Matrix<double,_4,_4,_0,_4,_4> **)(this + 8) = __position._M_current + 1;
                  }
                  return (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          *)this;
                }
              }
            }
          }
        }
      }
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                    "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 4, 4>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 4, 4>>]"
                   );
    }
  }
  local_400 = &local_488;
  local_3f0 = 4;
  local_408 = (Matrix<double,_4,_1,_0,_4,_1> *)local_318._8_8_;
  local_3f8 = (Matrix<double,_4,_1,_0,_4,_1> *)local_318._8_8_;
  __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                "Eigen::internal::block_evaluator<const Eigen::Matrix<double, 4, 1>, 4, 1, true>::block_evaluator(const XprType &) [ArgType = const Eigen::Matrix<double, 4, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
               );
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations1L1Q1P(
	Matrix<floatPrec, 4,1> P1, Matrix<floatPrec, 4,1> P1_B,
	Matrix<floatPrec, 4,1> Pi, Matrix<floatPrec, 4,1> Pi_B)
{

	// project points P1 and P1_B to planes Pi and Pi_B
	Matrix<floatPrec, 4,1> P1_pi, P1_pi_B;
	P1_pi.head(3) = P1.head(3) - (P1.head(3).dot(Pi.head(3)) + Pi(3)) * Pi.head(3);
	P1_pi(3) = 1.0;
	P1_pi_B.head(3) = P1_B.head(3) - (P1_B.head(3).dot(Pi_B.head(3)) + Pi_B(3)) * Pi_B.head(3);
	P1_pi_B(3) = 1.0;

	// translate frames to P1_pi and P1_pi_B
	Matrix<floatPrec, 4,4> transU, transU_B;
	transU.setIdentity(4,4);
	transU.topRightCorner(3, 1) = -P1_pi.head(3);
	transU_B.setIdentity(4,4);
	transU_B.topRightCorner(3, 1) = -P1_pi_B.head(3);

	// transform P2 and P2_B to the new frame
	Matrix<floatPrec, 4,1> Pi_1, Pi_B1;
	Pi_1 = transU.transpose().inverse() * Pi;
	Pi_B1 = transU_B.transpose().inverse() * Pi_B;

	// aling planes Pi and Pi_B with XY planes of both frames
	Matrix<floatPrec, 4,4> transV, transV_B;
	transV.setIdentity(4,4);
	transV_B.setIdentity(4,4);

	// compute rotation ref A
	Matrix<floatPrec, 3,1> v3, v1, v1_, t1, t2;
	t1.setZero();
	t1(0) = 1;
	t2.setZero();
	t2(1) = 1;
	v3 = Pi_1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV.topLeftCorner(1, 3) = v1.transpose();
	transV.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV.block(2, 0, 1, 3) = v3.transpose();

	// compute rotation ref B
	v3 = Pi_B1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV_B.topLeftCorner(1, 3) = v1.transpose();
	transV_B.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV_B.block(2, 0, 1, 3) = v3.transpose();

	vector<Matrix<floatPrec, 4,4>> out;
	Matrix<floatPrec, 4,4> TP, TP_B;
	TP = transV * transU;
	out.push_back(TP);

	TP_B = transV_B * transU_B;
	out.push_back(TP_B);

	return out;
}